

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall MidiOutAlsa::openPort(MidiOutAlsa *this,uint portNumber,string *portName)

{
  pointer pcVar1;
  undefined8 *puVar2;
  snd_seq_t *seq;
  undefined8 uVar3;
  char *pcVar4;
  size_type sVar5;
  long *plVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  size_t __n;
  ostream *poVar10;
  ostringstream *pinfo;
  _Alloc_hider _Var11;
  undefined8 uStack_290;
  ostringstream local_288 [8];
  snd_seq_addr_t sender;
  ios_base local_218 [264];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 uStack_6f;
  undefined6 uStack_6e;
  snd_seq_addr_t receiver;
  long local_60 [2];
  string local_50;
  
  pinfo = local_288;
  if ((this->super_MidiOutApi).super_MidiApi.connected_ == true) {
    uStack_290 = 0x10e9bb;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
               (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,0x110e0e
              );
    pcVar1 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
    uStack_290 = 0x10e9e0;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,
               pcVar1 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
    uStack_290 = 0x10e9ed;
    MidiApi::error((MidiApi *)this,WARNING,&local_b0);
    local_90.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
    _Var11._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return;
    }
  }
  else {
    uStack_290 = 0x10ea18;
    iVar7 = (*(this->super_MidiOutApi).super_MidiApi._vptr_MidiApi[8])(this);
    if (iVar7 == 0) {
      uStack_290 = 0x10ebb3;
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                 (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                 0x110e48);
      pcVar1 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
      uStack_290 = 0x10ebd5;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,
                 pcVar1 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
      uStack_290 = 0x10ebe5;
      MidiApi::error((MidiApi *)this,NO_DEVICES_FOUND,&local_90);
      pinfo = local_288;
      _Var11._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        return;
      }
    }
    else {
      uStack_290 = 0x10ea25;
      lVar9 = snd_seq_port_info_sizeof();
      lVar9 = -(lVar9 + 0xfU & 0xfffffffffffffff0);
      pinfo = local_288 + lVar9;
      *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ea3b;
      __n = snd_seq_port_info_sizeof();
      *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ea48;
      memset(pinfo,0,__n);
      puVar2 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
      seq = (snd_seq_t *)*puVar2;
      *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ea60;
      uVar8 = portInfo(seq,(snd_seq_port_info_t *)pinfo,0x42,portNumber);
      if (uVar8 == 0) {
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ec0d;
        std::__cxx11::ostringstream::ostringstream(local_288);
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ec21;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_288,"MidiOutAlsa::openPort: the \'portNumber\' argument (",0x32)
        ;
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ec30;
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_288);
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ec44;
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,") is invalid.",0xd);
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ec54;
        std::__cxx11::stringbuf::str();
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ec64;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_MidiOutApi).super_MidiApi.errorString_,&local_70);
        plVar6 = (long *)CONCAT62(uStack_6e,CONCAT11(uStack_6f,local_70));
        if (plVar6 != local_60) {
          *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ec7c;
          operator_delete(plVar6,local_60[0] + 1);
        }
        pcVar1 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
        sVar5 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ec98;
        std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + sVar5);
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10eca9;
        MidiApi::error((MidiApi *)this,INVALID_PARAMETER,&local_50);
        _Var11._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ecbe;
          operator_delete(_Var11._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ecd1;
        std::__cxx11::ostringstream::~ostringstream(local_288);
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ecdd;
        std::ios_base::~ios_base(local_218);
        return;
      }
      *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ea70;
      local_70 = (string)snd_seq_port_info_get_client(pinfo);
      *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ea7b;
      uStack_6f = snd_seq_port_info_get_port(pinfo);
      uVar3 = *puVar2;
      *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ea87;
      local_288[0] = (ostringstream)snd_seq_client_id(uVar3);
      if (*(int *)((long)puVar2 + 0xc) < 0) {
        uVar3 = *puVar2;
        pcVar1 = (portName->_M_dataplus)._M_p;
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10eaaa;
        iVar7 = snd_seq_create_simple_port(uVar3,pcVar1,0x21,0x100002);
        *(int *)((long)puVar2 + 0xc) = iVar7;
        if (iVar7 < 0) {
          pcVar4 = (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length;
          *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ed6f;
          std::__cxx11::string::_M_replace
                    ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,pcVar4,0x110eb0);
          pcVar1 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
          sVar5 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length;
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ed94;
          std::__cxx11::string::_M_construct<char*>((string *)&local_110,pcVar1,pcVar1 + sVar5);
          *(undefined8 *)(local_288 + lVar9 + -8) = 0x10eda4;
          MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_110);
          local_90.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
          _Var11._M_p = local_110._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p == &local_110.field_2) {
            return;
          }
          goto LAB_0010edb7;
        }
      }
      local_288[1] = *(ostringstream *)((long)puVar2 + 0xc);
      *(undefined8 *)(local_288 + lVar9 + -8) = 0x10eacc;
      iVar7 = snd_seq_port_subscribe_malloc(puVar2 + 2);
      uVar3 = puVar2[2];
      if (iVar7 < 0) {
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ece7;
        snd_seq_port_subscribe_free(uVar3);
        pcVar4 = (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length;
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ed03;
        std::__cxx11::string::_M_replace
                  ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,pcVar4,0x110ee8);
        pcVar1 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
        sVar5 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ed28;
        std::__cxx11::string::_M_construct<char*>((string *)&local_f0,pcVar1,pcVar1 + sVar5);
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10ed38;
        MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_f0);
        local_90.field_2._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
        _Var11._M_p = local_f0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
          return;
        }
      }
      else {
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10eae4;
        snd_seq_port_subscribe_set_sender(uVar3,local_288);
        uVar3 = puVar2[2];
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10eaf1;
        snd_seq_port_subscribe_set_dest(uVar3,&local_70);
        uVar3 = puVar2[2];
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10eaff;
        snd_seq_port_subscribe_set_time_update(uVar3,1);
        uVar3 = puVar2[2];
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10eb0d;
        snd_seq_port_subscribe_set_time_real(uVar3,1);
        uVar3 = *puVar2;
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10eb1a;
        iVar7 = snd_seq_subscribe_port(uVar3);
        if (iVar7 == 0) {
          (this->super_MidiOutApi).super_MidiApi.connected_ = true;
          return;
        }
        uVar3 = puVar2[2];
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10eb2a;
        snd_seq_port_subscribe_free(uVar3);
        pcVar4 = (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length;
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10eb46;
        std::__cxx11::string::_M_replace
                  ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,pcVar4,0x110f23);
        pcVar1 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
        sVar5 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10eb6b;
        std::__cxx11::string::_M_construct<char*>((string *)&local_d0,pcVar1,pcVar1 + sVar5);
        *(undefined8 *)(local_288 + lVar9 + -8) = 0x10eb7b;
        MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_d0);
        local_90.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
        _Var11._M_p = local_d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == &local_d0.field_2) {
          return;
        }
      }
    }
  }
LAB_0010edb7:
  *(undefined8 *)((snd_seq_port_info_t *)pinfo + -8) = 0x10edbf;
  operator_delete(_Var11._M_p,local_90.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void MidiOutAlsa :: openPort( unsigned int portNumber, const std::string &portName )
{
  if ( connected_ ) {
    errorString_ = "MidiOutAlsa::openPort: a valid connection already exists!";
    error( RtMidiError::WARNING, errorString_ );
    return;
  }

  unsigned int nSrc = this->getPortCount();
  if ( nSrc < 1 ) {
    errorString_ = "MidiOutAlsa::openPort: no MIDI output sources found!";
    error( RtMidiError::NO_DEVICES_FOUND, errorString_ );
    return;
  }

  snd_seq_port_info_t *pinfo;
  snd_seq_port_info_alloca( &pinfo );
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( portInfo( data->seq, pinfo, SND_SEQ_PORT_CAP_WRITE|SND_SEQ_PORT_CAP_SUBS_WRITE, (int) portNumber ) == 0 ) {
    std::ostringstream ost;
    ost << "MidiOutAlsa::openPort: the 'portNumber' argument (" << portNumber << ") is invalid.";
    errorString_ = ost.str();
    error( RtMidiError::INVALID_PARAMETER, errorString_ );
    return;
  }

  snd_seq_addr_t sender, receiver;
  receiver.client = snd_seq_port_info_get_client( pinfo );
  receiver.port = snd_seq_port_info_get_port( pinfo );
  sender.client = snd_seq_client_id( data->seq );

  if ( data->vport < 0 ) {
    data->vport = snd_seq_create_simple_port( data->seq, portName.c_str(),
                                              SND_SEQ_PORT_CAP_READ|SND_SEQ_PORT_CAP_SUBS_READ,
                                              SND_SEQ_PORT_TYPE_MIDI_GENERIC|SND_SEQ_PORT_TYPE_APPLICATION );
    if ( data->vport < 0 ) {
      errorString_ = "MidiOutAlsa::openPort: ALSA error creating output port.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
      return;
    }
  }

  sender.port = data->vport;

  // Make subscription
  if ( snd_seq_port_subscribe_malloc( &data->subscription ) < 0 ) {
    snd_seq_port_subscribe_free( data->subscription );
    errorString_ = "MidiOutAlsa::openPort: error allocating port subscription.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }
  snd_seq_port_subscribe_set_sender( data->subscription, &sender );
  snd_seq_port_subscribe_set_dest( data->subscription, &receiver );
  snd_seq_port_subscribe_set_time_update( data->subscription, 1 );
  snd_seq_port_subscribe_set_time_real( data->subscription, 1 );
  if ( snd_seq_subscribe_port( data->seq, data->subscription ) ) {
    snd_seq_port_subscribe_free( data->subscription );
    errorString_ = "MidiOutAlsa::openPort: ALSA error making port connection.";
    error( RtMidiError::DRIVER_ERROR, errorString_ );
    return;
  }

  connected_ = true;
}